

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

Writer * mp::operator<<(Writer *w,NLHeader *h)

{
  int iVar1;
  uint uVar2;
  Buffer<char> *pBVar3;
  size_t sVar4;
  long lVar5;
  FormatSpec local_98;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  
  iVar1 = (h->super_NLInfo).super_NLInfo_C.format;
  pBVar3 = w->buffer_;
  if (pBVar3->size_ == pBVar3->capacity_) {
    (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
  }
  sVar4 = pBVar3->size_;
  pBVar3->size_ = sVar4 + 1;
  pBVar3->ptr_[sVar4] = (iVar1 == 0) * '\x05' + 'b';
  fmt::BasicWriter<char>::write_decimal<int>(w,(h->super_NLInfo).super_NLInfo_C.num_ampl_options);
  if (0 < (h->super_NLInfo).super_NLInfo_C.num_ampl_options) {
    lVar5 = 0;
    do {
      pBVar3 = w->buffer_;
      if (pBVar3->size_ == pBVar3->capacity_) {
        (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
      }
      sVar4 = pBVar3->size_;
      pBVar3->size_ = sVar4 + 1;
      pBVar3->ptr_[sVar4] = ' ';
      fmt::BasicWriter<char>::write_decimal<long>
                (w,(h->super_NLInfo).super_NLInfo_C.ampl_options[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (h->super_NLInfo).super_NLInfo_C.num_ampl_options);
  }
  if ((h->super_NLInfo).super_NLInfo_C.ampl_options[1] == 3) {
    pBVar3 = w->buffer_;
    if (pBVar3->size_ == pBVar3->capacity_) {
      (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
    }
    sVar4 = pBVar3->size_;
    pBVar3->size_ = sVar4 + 1;
    pBVar3->ptr_[sVar4] = ' ';
    local_98.super_AlignSpec.super_WidthSpec.width_ = 0;
    local_98.super_AlignSpec.super_WidthSpec.fill_ = L' ';
    local_98.super_AlignSpec.align_ = ALIGN_DEFAULT;
    local_98.flags_ = 0;
    local_98._16_5_ = 0xffffffff;
    fmt::BasicWriter<char>::write_double<double>
              (w,(h->super_NLInfo).super_NLInfo_C.ampl_vbtol,&local_98);
  }
  pBVar3 = w->buffer_;
  if (pBVar3->size_ == pBVar3->capacity_) {
    (**pBVar3->_vptr_Buffer)(pBVar3,pBVar3->size_ + 1);
  }
  sVar4 = pBVar3->size_;
  pBVar3->size_ = sVar4 + 1;
  pBVar3->ptr_[sVar4] = '\n';
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  local_98._16_8_ = ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
  local_78 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_objs;
  local_68 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_ranges;
  local_58 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns;
  local_48 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons;
  fmt::BasicWriter<char>::write(w,0x177685,(void *)0x222222,(size_t)&local_98);
  uVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds;
  local_68 = (ulong)uVar2;
  local_78 = (ulong)((h->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds - uVar2);
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_cons;
  local_98._16_8_ = ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_objs);
  local_58 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_dbl_ineqs;
  local_48 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_vars_with_nz_lb;
  fmt::BasicWriter<char>::write(w,0x177685,(void *)0x222222,(size_t)&local_98);
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_net_cons;
  local_98._16_8_ = ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_cons)
  ;
  fmt::BasicWriter<char>::write(w,0x177691,(void *)0x22,(size_t)&local_98);
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
  local_98._16_8_ = ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs)
  ;
  local_78 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both;
  fmt::BasicWriter<char>::write(w,0x17768e,(void *)0x222,(size_t)&local_98);
  uVar2 = (h->super_NLInfo).super_NLInfo_C.format;
  if (uVar2 != 0) {
    uVar2 = (h->super_NLInfo).super_NLInfo_C.arith_kind;
  }
  local_78 = (ulong)uVar2;
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_vars;
  local_98._16_8_ = ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
  local_68 = (ulong)(uint)(h->super_NLInfo).super_NLInfo_C.flags;
  fmt::BasicWriter<char>::write(w,0x17768b,(void *)0x2222,(size_t)&local_98);
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars;
  local_98._16_8_ =
       ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars);
  local_78 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both
  ;
  local_68 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons
  ;
  local_58 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs
  ;
  fmt::BasicWriter<char>::write(w,0x177688,(void *)0x22222,(size_t)&local_98);
  local_98.super_AlignSpec.super_WidthSpec =
       (WidthSpec)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_con_nonzeros;
  local_98._16_8_ = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_obj_nonzeros;
  fmt::BasicWriter<char>::write(w,0x177691,(void *)0x55,(size_t)&local_98);
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.max_con_name_len;
  local_98._16_8_ = ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.max_var_name_len);
  fmt::BasicWriter<char>::write(w,0x177691,(void *)0x22,(size_t)&local_98);
  local_98.super_AlignSpec.super_WidthSpec.fill_ = L'\0';
  local_98.super_AlignSpec.super_WidthSpec.width_ =
       (h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both;
  local_98._16_8_ =
       ZEXT48((uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons);
  local_78 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs;
  local_68 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.
                          num_common_exprs_in_single_cons;
  local_58 = (ulong)(uint)(h->super_NLProblemInfo).super_NLProblemInfo_C.
                          num_common_exprs_in_single_objs;
  fmt::BasicWriter<char>::write(w,0x177688,(void *)0x22222,(size_t)&local_98);
  return w;
}

Assistant:

fmt::Writer &mp::operator<<(fmt::Writer &w, const NLHeader &h) {
  w << (h.format == NLHeader::TEXT ? 'g' : 'b') << h.num_ampl_options;
  for (int i = 0; i < h.num_ampl_options; ++i)
    w << ' ' << h.ampl_options[i];
  if (h.ampl_options[USE_VBTOL_OPTION] == READ_VBTOL)
    w << ' ' << h.ampl_vbtol;
  w << '\n';
  w.write(" {} {} {} {} {} {}\n",
      h.num_vars, h.num_algebraic_cons, h.num_objs,
      h.num_ranges, h.num_eqns, h.num_logical_cons);
  w.write(" {} {} {} {} {} {}\n",
      h.num_nl_cons, h.num_nl_objs,
      h.num_compl_conds - h.num_nl_compl_conds,
      h.num_nl_compl_conds, h.num_compl_dbl_ineqs,
      h.num_compl_vars_with_nz_lb);
  w.write(" {} {}\n", h.num_nl_net_cons, h.num_linear_net_cons);
  w.write(" {} {} {}\n",
      h.num_nl_vars_in_cons, h.num_nl_vars_in_objs, h.num_nl_vars_in_both);
  w.write(" {} {} {} {}\n",
      h.num_linear_net_vars, h.num_funcs,
          h.format == NLHeader::TEXT ? 0 : h.arith_kind, h.flags);
  w.write(" {} {} {} {} {}\n",
      h.num_linear_binary_vars, h.num_linear_integer_vars,
      h.num_nl_integer_vars_in_both, h.num_nl_integer_vars_in_cons,
      h.num_nl_integer_vars_in_objs);
  w.write(" {} {}\n", h.num_con_nonzeros, h.num_obj_nonzeros);
  w.write(" {} {}\n", h.max_con_name_len, h.max_var_name_len);
  w.write(" {} {} {} {} {}\n",
      h.num_common_exprs_in_both, h.num_common_exprs_in_cons,
      h.num_common_exprs_in_objs, h.num_common_exprs_in_single_cons,
      h.num_common_exprs_in_single_objs);
  return w;
}